

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

void magmadecrypt(gost_ctx *c,byte *in,byte *out)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  uVar5 = *(uint *)in;
  uVar3 = *(uint *)(in + 4);
  uVar7 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  iVar1 = c->mask[0] + c->key[0];
  uVar3 = iVar1 + uVar7;
  uVar3 = *(uint *)((long)c->k65 + (ulong)(uVar3 >> 0xe & 0x3fc)) | c->k87[uVar3 >> 0x18] |
          c->k43[uVar3 >> 8 & 0xff] | c->k21[uVar3 & 0xff];
  iVar2 = c->mask[1] + c->key[1];
  uVar3 = (uVar3 << 0xb | uVar3 >> 0x15) ^
          (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
  uVar5 = iVar2 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar6 = c->mask[2] + c->key[2];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar6 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar8 = c->mask[3] + c->key[3];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar8 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar9 = c->mask[4] + c->key[4];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar9 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar4 = c->mask[5] + c->key[5];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar4 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar10 = c->mask[6] + c->key[6];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar10 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  iVar11 = c->mask[7] + c->key[7];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar11 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar11 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar10 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar4 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar9 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar8 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar6 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar2 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar1 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar11 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar10 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar4 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar9 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar8 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar6 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar2 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar1 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar11 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar10 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar4 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar9 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar8 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar6 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  uVar5 = iVar2 + uVar7;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar3 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar3;
  uVar5 = iVar1 + uVar3;
  uVar5 = *(uint *)((long)c->k65 + (ulong)(uVar5 >> 0xe & 0x3fc)) | c->k87[uVar5 >> 0x18] |
          c->k43[uVar5 >> 8 & 0xff] | c->k21[uVar5 & 0xff];
  uVar7 = (uVar5 << 0xb | uVar5 >> 0x15) ^ uVar7;
  *(uint *)(out + 4) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  out[3] = (byte)uVar7;
  out[2] = (byte)(uVar7 >> 8);
  out[1] = (byte)(uVar7 >> 0x10);
  *out = (byte)(uVar7 >> 0x18);
  return;
}

Assistant:

void magmadecrypt(gost_ctx * c, const byte * in, byte * out)
{
    register word32 n1, n2;     /* As named in the GOST */
    n1 = in[7-0] | (in[7-1] << 8) | (in[7-2] << 16) | ((word32) in[7-3] << 24);
    n2 = in[7-4] | (in[7-5] << 8) | (in[7-6] << 16) | ((word32) in[7-7] << 24);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    out[7-0] = (byte) (n2 & 0xff);
    out[7-1] = (byte) ((n2 >> 8) & 0xff);
    out[7-2] = (byte) ((n2 >> 16) & 0xff);
    out[7-3] = (byte) (n2 >> 24);
    out[7-4] = (byte) (n1 & 0xff);
    out[7-5] = (byte) ((n1 >> 8) & 0xff);
    out[7-6] = (byte) ((n1 >> 16) & 0xff);
    out[7-7] = (byte) (n1 >> 24);
}